

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t
xcb_input_device_resolution_state_resolution_max_end(xcb_input_device_resolution_state_t *R)

{
  void *pvVar1;
  xcb_generic_iterator_t xVar2;
  
  pvVar1 = (void *)((long)&R[(ulong)R->num_valuators + 1].control_id +
                   (ulong)R->num_valuators * 4 +
                   (ulong)((int)R - (int)(R + (ulong)R->num_valuators + 1) & 3));
  xVar2._8_8_ = (ulong)(uint)((int)pvVar1 - (int)R) << 0x20;
  xVar2.data = pvVar1;
  return xVar2;
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_resolution_state_resolution_max_end (const xcb_input_device_resolution_state_t *R)
{
    xcb_generic_iterator_t i;
    xcb_generic_iterator_t prev = xcb_input_device_resolution_state_resolution_min_end(R);
    i.data = ((uint32_t *) ((char*) prev.data + XCB_TYPE_PAD(uint32_t, prev.index))) + (R->num_valuators);
    i.rem = 0;
    i.index = (char *) i.data - (char *) R;
    return i;
}